

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::init
          (LayoutBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderType SVar1;
  TestType TVar2;
  int iVar3;
  deUint32 dVar4;
  GLint GVar5;
  uint uVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  NotSupportedError *pNVar8;
  undefined4 extraout_var_00;
  TestError *pTVar9;
  uint max;
  int ndx;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int bpoint_2;
  GLint maxFragmentUnits;
  GLint maxCombinedUnits;
  GLint maxVertexUnits;
  GLint numBindingPoints;
  vector<unsigned_int,_std::allocator<unsigned_int>_> highBindingPoints;
  Random rnd_1;
  int bpoint;
  undefined4 uStack_1c4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  Random rnd;
  long lVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar4 ^ 0xff23a4);
  numBindingPoints = 0;
  maxVertexUnits = 0;
  maxFragmentUnits = 0;
  maxCombinedUnits = 0;
  (**(code **)(lVar7 + 0x868))(this->m_maxVertexUnitsEnum);
  (**(code **)(lVar7 + 0x868))(this->m_maxFragmentUnitsEnum,&maxFragmentUnits);
  (**(code **)(lVar7 + 0x868))(this->m_maxCombinedUnitsEnum,&maxCombinedUnits);
  (**(code **)(lVar7 + 0x868))(this->m_maxBindingPointEnum,&numBindingPoints);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x192);
  _bpoint = (uint *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1c0);
  std::operator<<((ostream *)&_Stack_1c0,"Maximum units for uniform type in the vertex shader: ");
  std::ostream::operator<<((ostringstream *)&_Stack_1c0,maxVertexUnits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bpoint,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1c0);
  _bpoint = (uint *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1c0);
  std::operator<<((ostream *)&_Stack_1c0,"Maximum units for uniform type in the fragment shader: ");
  std::ostream::operator<<((ostringstream *)&_Stack_1c0,maxFragmentUnits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bpoint,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1c0);
  _bpoint = (uint *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1c0);
  std::operator<<((ostream *)&_Stack_1c0,"Maximum combined units for uniform type: ");
  std::ostream::operator<<((ostringstream *)&_Stack_1c0,maxCombinedUnits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bpoint,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1c0);
  _bpoint = (uint *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1c0);
  std::operator<<((ostream *)&_Stack_1c0,"Maximum binding point for uniform type: ");
  std::ostream::operator<<((ostringstream *)&_Stack_1c0,numBindingPoints + -1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bpoint,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1c0);
  SVar1 = this->m_shaderType;
  uVar6 = maxVertexUnits;
  if (((SVar1 != SHADERTYPE_VERTEX) && (uVar6 = maxFragmentUnits, SVar1 != SHADERTYPE_FRAGMENT)) &&
     (uVar6 = 0, SVar1 == SHADERTYPE_ALL)) {
    uVar6 = maxCombinedUnits / 2;
  }
  TVar2 = this->m_testType;
  if (TVar2 < TESTTYPE_BINDING_MULTIPLE) {
    iVar3 = 1;
LAB_0043f748:
    this->m_numBindings = iVar3;
  }
  else {
    if (TVar2 - TESTTYPE_BINDING_ARRAY < 2) {
      if ((int)uVar6 < 2) {
        pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bpoint,"Not enough uniforms available for test",
                   (allocator<char> *)&highBindingPoints);
        tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&bpoint);
        __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
LAB_0043f72f:
      max = 7;
      if (uVar6 < 7) {
        max = uVar6;
      }
      iVar3 = de::Random::getInt(&rnd,2,max);
      goto LAB_0043f748;
    }
    if (TVar2 == TESTTYPE_BINDING_MULTIPLE) {
      if ((int)uVar6 < 2) {
        pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bpoint,"Not enough uniforms available for test",
                   (allocator<char> *)&highBindingPoints);
        tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&bpoint);
        __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      goto LAB_0043f72f;
    }
  }
  GVar5 = numBindingPoints;
  SVar1 = this->m_shaderType;
  if (SVar1 != SHADERTYPE_VERTEX) {
    if (SVar1 == SHADERTYPE_FRAGMENT) {
      iVar3 = this->m_numBindings;
      if (iVar3 <= maxFragmentUnits) goto LAB_0043f857;
      goto LAB_0043f802;
    }
    if (SVar1 != SHADERTYPE_ALL) {
      iVar3 = this->m_numBindings;
      goto LAB_0043f857;
    }
  }
  iVar3 = this->m_numBindings;
  if (maxVertexUnits < iVar3) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bpoint,"Vertex shader: not enough uniforms available for test",
               (allocator<char> *)&highBindingPoints);
    tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&bpoint);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((SVar1 == SHADERTYPE_ALL) || (SVar1 == SHADERTYPE_FRAGMENT)) {
    if (maxFragmentUnits < iVar3) {
LAB_0043f802:
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bpoint,"Fragment shader: not enough uniforms available for test",
                 (allocator<char> *)&highBindingPoints);
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&bpoint);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((SVar1 == SHADERTYPE_ALL) && (maxCombinedUnits < iVar3 * 2)) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bpoint,"Not enough uniforms available for test",
                 (allocator<char> *)&highBindingPoints);
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&bpoint);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
LAB_0043f857:
  if (numBindingPoints < iVar3) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bpoint,"Not enough binding points available for test",
               (allocator<char> *)&highBindingPoints);
    tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&bpoint);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd_1.m_rnd,dVar4 ^ 0xff23a4);
  switch(this->m_testType) {
  case TESTTYPE_BINDING_SINGLE:
    iVar3 = de::Random::getInt(&rnd_1,0,GVar5 + -1);
    bpoint = iVar3;
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&bpoint);
    break;
  case TESTTYPE_BINDING_MAX:
    bpoint = GVar5 + -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_bindings,&bpoint);
    break;
  case TESTTYPE_BINDING_MULTIPLE:
    local_1b8._M_allocated_capacity = 0;
    highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _bpoint = (uint *)0x0;
    _Stack_1c0._M_current = (uint *)0x0;
    highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = (int)((long)GVar5 / 2);
    uVar11 = (long)GVar5 / 2 & 0xffffffff;
    iVar10 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
      bpoint_2 = iVar10;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bpoint,(uint *)&bpoint_2);
    }
    while (iVar3 = (int)uVar11, iVar3 < GVar5) {
      bpoint_2 = iVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&highBindingPoints,(uint *)&bpoint_2);
      uVar11 = (ulong)(iVar3 + 1);
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (&rnd_1,_bpoint,_Stack_1c0);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (&rnd_1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )highBindingPoints.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    for (uVar6 = 0; (int)uVar6 < this->m_numBindings; uVar6 = uVar6 + 1) {
      if ((uVar6 & 1) == 0) {
        bpoint_2 = _Stack_1c0._M_current[-1];
        _Stack_1c0._M_current = _Stack_1c0._M_current + -1;
        std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&bpoint_2);
      }
      else {
        bpoint_2 = highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
        highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
        std::vector<int,_std::allocator<int>_>::push_back(&this->m_bindings,&bpoint_2);
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bpoint);
    break;
  case TESTTYPE_BINDING_ARRAY:
    iVar3 = de::Random::getInt(&rnd_1,0,GVar5 - this->m_numBindings);
    for (iVar10 = 0; iVar10 < this->m_numBindings; iVar10 = iVar10 + 1) {
      bpoint = iVar3 + iVar10;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_bindings,&bpoint);
    }
    break;
  case TESTTYPE_BINDING_MAX_ARRAY:
    iVar3 = this->m_numBindings;
    iVar12 = GVar5 - iVar3;
    for (iVar10 = 0; iVar10 < iVar3; iVar10 = iVar10 + 1) {
      bpoint = iVar12 + iVar10;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_bindings,&bpoint);
      iVar3 = this->m_numBindings;
    }
  }
  _bpoint = (uint *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1c0);
  std::operator<<((ostream *)&_Stack_1c0,"Creating test shaders");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&bpoint,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1c0);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar3);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)CONCAT44(extraout_var_00,iVar3));
  if ((this->m_program->m_program).m_info.linkOk == false) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bpoint,"Shader compile failed",(allocator<char> *)&highBindingPoints);
    tcu::TestError::TestError(pTVar9,(string *)&bpoint);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  dVar4 = (this->m_program->m_program).m_program;
  GVar5 = (**(code **)(lVar7 + 0x780))(dVar4,"a_position");
  this->m_shaderProgramPosLoc = GVar5;
  uVar6 = (**(code **)(lVar7 + 0xb48))(dVar4);
  this->m_shaderProgramArrayNdxLoc = uVar6;
  this->m_vertexBuffer = 0;
  this->m_indexBuffer = 0;
  _bpoint = (uint *)0xbf800000bf800000;
  _Stack_1c0._M_current = (pointer)0x3f8000003f800000;
  local_1b8._M_allocated_capacity = 0x3f800000bf800000;
  local_1b8._8_8_ = 0x3f8000003f800000;
  local_1a8 = 0x3f800000;
  uStack_1a4 = 0xbf800000;
  uStack_1a0 = 0x3f800000;
  uStack_19c = 0x3f800000;
  highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200010000;
  highBindingPoints.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(highBindingPoints.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,0x30002);
  if ((int)(uVar6 | this->m_shaderProgramPosLoc) < 0) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,
               "(m_shaderProgramPosLoc >= 0) && (m_shaderProgramArrayNdxLoc >= 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x1f7);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_indexBuffer);
  (**(code **)(lVar7 + 0x40))(0x8893,this->m_indexBuffer);
  (**(code **)(lVar7 + 0x150))(0x8893,0xc,&highBindingPoints,0x88e4);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Index buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x1fd);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_vertexBuffer);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_vertexBuffer);
  (**(code **)(lVar7 + 0x150))(0x8892,0x30,&bpoint,0x88e4);
  (**(code **)(lVar7 + 0x610))(this->m_shaderProgramPosLoc);
  (**(code **)(lVar7 + 0x19f0))(this->m_shaderProgramPosLoc,3,0x1406,0,0,0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Vertex buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x205);
  return extraout_EAX;
}

Assistant:

void LayoutBindingRenderCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	{
		de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
		glw::GLint				numBindingPoints	= 0;	// Number of available binding points
		glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
		glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
		glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
		glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

		gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
		gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);
		gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
		gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

		// Select maximum number of uniforms used for the test
		switch (m_shaderType)
		{
			case SHADERTYPE_VERTEX:
				maxUnits = maxVertexUnits;
				break;

			case SHADERTYPE_FRAGMENT:
				maxUnits = maxFragmentUnits;
				break;

			case SHADERTYPE_ALL:
				maxUnits = maxCombinedUnits/2;
				break;

			default:
				DE_ASSERT(false);
		}

		// Select the number of uniforms (= bindings) used for this test
		switch (m_testType)
		{
			case TESTTYPE_BINDING_SINGLE:
			case TESTTYPE_BINDING_MAX:
				m_numBindings = 1;
				break;

			case TESTTYPE_BINDING_MULTIPLE:
				if (maxUnits < 2)
					throw tcu::NotSupportedError("Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_MULTIPLE_INSTANCES, maxUnits));
				break;

			case TESTTYPE_BINDING_ARRAY:
			case TESTTYPE_BINDING_MAX_ARRAY:
				if (maxUnits < 2)
					throw tcu::NotSupportedError("Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
				break;

			default:
				DE_ASSERT(false);
		}

		// Check that we have enough uniforms in different shaders to perform the tests
		if ( ((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
			throw tcu::NotSupportedError("Vertex shader: not enough uniforms available for test");
		if ( ((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
			throw tcu::NotSupportedError("Fragment shader: not enough uniforms available for test");
		if ( (m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*2) )
			throw tcu::NotSupportedError("Not enough uniforms available for test");

		// Check that we have enough binding points to perform the tests
		if (numBindingPoints < m_numBindings)
			throw tcu::NotSupportedError("Not enough binding points available for test");

		// Initialize the binding points i.e. populate the two binding point vectors
		initBindingPoints(0, numBindingPoints);
	}

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("Shader compile failed");

	// Setup vertex and index buffers
	{
		// Get attribute and uniform locations
		const deUint32	program	= m_program->getProgram();

		m_shaderProgramPosLoc		= gl.getAttribLocation(program, "a_position");
		m_shaderProgramArrayNdxLoc	= gl.getUniformLocation(program, "u_arrayNdx");
		m_vertexBuffer				= 0;
		m_indexBuffer				= 0;

		// Setup buffers so that we render one quad covering the whole viewport
		const Vec3 vertices[] =
		{
			Vec3(-1.0f, -1.0f, +1.0f),
			Vec3(+1.0f, -1.0f, +1.0f),
			Vec3(+1.0f, +1.0f, +1.0f),
			Vec3(-1.0f, +1.0f, +1.0f),
		};

		const deUint16 indices[] =
		{
			0, 1, 2,
			0, 2, 3,
		};

		TCU_CHECK((m_shaderProgramPosLoc >= 0) && (m_shaderProgramArrayNdxLoc >= 0));

		// Generate and bind index buffer
		gl.genBuffers(1, &m_indexBuffer);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (DE_LENGTH_OF_ARRAY(indices)*(glw::GLsizeiptr)sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Index buffer setup failed");

		// Generate and bind vertex buffer
		gl.genBuffers(1, &m_vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (DE_LENGTH_OF_ARRAY(vertices)*(glw::GLsizeiptr)sizeof(vertices[0])), &vertices[0], GL_STATIC_DRAW);
		gl.enableVertexAttribArray(m_shaderProgramPosLoc);
		gl.vertexAttribPointer(m_shaderProgramPosLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Vertex buffer setup failed");
	}
}